

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O3

void des_cbc_encrypt(ssh_cipher *ciph,void *vdata,int len)

{
  uint uVar1;
  ssh_cipheralg *psVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 *puVar6;
  uint uVar7;
  LR LVar8;
  ulong uVar9;
  
  if (0 < len) {
    psVar2 = ciph[-1].vt;
    uVar5 = len + 8;
    puVar6 = (undefined1 *)((long)vdata + 7);
    do {
      uVar1 = *(uint *)(puVar6 + -7);
      uVar9 = CONCAT17(puVar6[-3],
                       CONCAT16(puVar6[-2],
                                CONCAT15(puVar6[-1],
                                         CONCAT14(*puVar6,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                                          (uVar1 & 0xff00) << 8 | uVar1 << 0x18))))
              ^ (ulong)psVar2;
      uVar1 = (uint)(uVar9 >> 0x20);
      uVar3 = ((uint)(uVar9 >> 4) & 0xfffffff ^ uVar1) & 0xf0f0f0f;
      uVar4 = uVar3 << 4 ^ (uint)uVar9;
      uVar3 = uVar3 ^ uVar1;
      uVar7 = uVar3 & 0xffff ^ uVar4 >> 0x10;
      uVar4 = uVar7 << 0x10 ^ uVar4;
      uVar7 = uVar7 ^ uVar3;
      uVar3 = (uVar7 >> 2 ^ uVar4) & 0x33333333;
      uVar7 = uVar3 * 4 ^ uVar7;
      uVar3 = uVar3 ^ uVar4;
      uVar1 = (uVar7 >> 8 ^ uVar3) & 0xff00ff;
      uVar7 = uVar1 << 8 ^ uVar7;
      uVar1 = uVar1 ^ uVar3;
      uVar4 = (uVar1 >> 1 ^ uVar7) & 0x55555555;
      uVar1 = uVar4 * 2 ^ uVar1;
      uVar4 = uVar4 ^ uVar7;
      LVar8.L = uVar1 >> 1 | (uint)((uVar1 & 1) != 0) << 0x1f;
      LVar8.R = uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f;
      LVar8 = des_inner_cipher(LVar8,(des_keysched *)(ciph + -0x11),0,1);
      uVar1 = LVar8.L;
      uVar4 = LVar8.R << 1 | (uint)((long)LVar8 < 0);
      uVar3 = (uVar1 & 0x7fffffff ^ uVar4) & 0x55555555;
      uVar7 = uVar3 * 2 ^ (uVar1 << 1 | (uint)((int)uVar1 < 0));
      uVar3 = uVar3 ^ uVar4;
      uVar1 = (uVar3 >> 8 ^ uVar7) & 0xff00ff;
      uVar3 = uVar1 << 8 ^ uVar3;
      uVar1 = uVar1 ^ uVar7;
      uVar4 = (uVar3 >> 2 ^ uVar1) & 0x33333333;
      uVar3 = uVar4 * 4 ^ uVar3;
      uVar4 = uVar4 ^ uVar1;
      uVar7 = uVar3 & 0xffff ^ uVar4 >> 0x10;
      uVar4 = uVar7 << 0x10 ^ uVar4;
      uVar7 = uVar7 ^ uVar3;
      uVar1 = (uVar4 >> 4 ^ uVar7) & 0xf0f0f0f;
      uVar4 = uVar1 << 4 ^ uVar4;
      uVar1 = uVar1 ^ uVar7;
      psVar2 = (ssh_cipheralg *)CONCAT44(uVar1,uVar4);
      *(ushort *)(puVar6 + -5) = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
      puVar6[-6] = (char)(uVar4 >> 0x10);
      puVar6[-7] = (char)(uVar4 >> 0x18);
      *puVar6 = (char)uVar1;
      puVar6[-1] = (char)(uVar1 >> 8);
      puVar6[-2] = (char)(uVar1 >> 0x10);
      puVar6[-3] = (char)(uVar1 >> 0x18);
      ciph[-1].vt = psVar2;
      uVar5 = uVar5 - 8;
      puVar6 = puVar6 + 8;
    } while (8 < uVar5);
  }
  return;
}

Assistant:

static void des_cbc_encrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des_cbc_ctx *ctx = container_of(ciph, struct des_cbc_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    for (; len > 0; len -= 8, data += 8) {
        LR plaintext = des_load_lr(data);
        LR cipher_in = des_xor_lr(plaintext, ctx->iv);
        LR ciphertext = des_full_cipher(cipher_in, &ctx->sched, ENCIPHER);
        des_store_lr(data, ciphertext);
        ctx->iv = ciphertext;
    }
}